

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O2

void __thiscall
ShadingPass::execute
          (ShadingPass *this,mat4 viewMatrix,mat4 projMatrix,float zNear,float zFar,vec3 lightDir,
          mat4 lightMatrix,Cubemap *cubemap,uint albedo_tex,uint normal_tex,uint shadow_tex,
          uint rough_met_tex,uint position_tex,uint ssao_tex,Cubemap *irradiance,uint vao)

{
  Shader *pSVar1;
  ulong uVar2;
  Block *pBVar3;
  GpuCtx *pGVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  ExplicitProducer *pEVar9;
  ExplicitProducer *extraout_RAX;
  GpuCtxWrapper *pGVar10;
  ExplicitProducer *extraout_RAX_00;
  ExplicitProducer *extraout_RAX_01;
  ExplicitProducer *extraout_RAX_02;
  ExplicitProducer *pEVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  allocator<char> local_3da;
  GLScopedDebugGroup local_3d9;
  Cubemap *local_3d8;
  float local_3cc;
  float local_3c8;
  uint local_3c4;
  uint local_3c0;
  uint local_3bc;
  uint local_3b8;
  undefined4 local_3b4;
  tmat4x4<float,_(glm::precision)0> local_3b0;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_370;
  undefined8 local_364;
  undefined4 local_35c;
  undefined8 local_358;
  undefined4 local_350;
  undefined1 local_348 [16];
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_70;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  local_3b4 = lightDir.field_0._8_4_;
  local_348._8_4_ = in_XMM2_Dc;
  local_348._0_8_ = lightDir.field_0._0_8_;
  local_348._12_4_ = in_XMM2_Dd;
  local_3d8 = cubemap;
  local_3cc = zFar;
  local_3c8 = zNear;
  local_3c4 = rough_met_tex;
  local_3c0 = shadow_tex;
  local_3bc = normal_tex;
  local_3b8 = albedo_tex;
  pEVar9 = tracy::GetToken();
  uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar11 = pEVar9;
  if ((uVar2 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
    pEVar11 = extraout_RAX;
  }
  pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
  uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar13] = '\x0f';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar13 + 9) =
       &execute::__tracy_source_location451;
  (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  pGVar10 = tracy::GetGpuCtx();
  pGVar4 = pGVar10->ptr;
  uVar8 = pGVar4->m_head;
  uVar12 = uVar8 + 1 & 0xffff;
  pGVar4->m_head = uVar12;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar12 == pGVar4->m_tail) goto LAB_0031e62c;
  pGVar10 = tracy::GetGpuCtx();
  (*(code *)uVar6)((ulong)pGVar10->ptr->m_query[uVar8],0x8e28);
  pEVar9 = tracy::GetToken();
  uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
  pEVar11 = pEVar9;
  if ((uVar2 & 0xffff) == 0) {
    tracy::moodycamel::
    ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
    pEVar11 = extraout_RAX_00;
  }
  pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
  uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
  (pBVar3->field_0).elements[uVar13] = '!';
  uVar5 = rdtsc();
  *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
       (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
  *(undefined4 *)((long)&pBVar3->field_0 + uVar13 + 9) = 0;
  *(short *)((long)&pBVar3->field_0 + uVar13 + 0xd) = (short)uVar8;
  pGVar10 = tracy::GetGpuCtx();
  (pBVar3->field_0).elements[uVar13 + 0xf] = pGVar10->ptr->m_context;
  *(SourceLocationData **)((long)&pBVar3->field_0 + uVar13 + 0x10) =
       &execute::__tracy_gpu_source_location452;
  (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
  (*gl3wProcs.ptr[0x1b0])(0x824a,0,0xffffffffffffffff,"Shading pass");
  GLScopedDebugGroup::~GLScopedDebugGroup(&local_3d9);
  (*gl3wProcs.ptr[0xf])(0x8d40);
  (*gl3wProcs.ptr[0x2e])(0x4000);
  if (this->skybox_choice == 0) {
    if (local_3d8 != (Cubemap *)0x0) goto LAB_0031d9be;
  }
  else {
    local_3d8 = irradiance;
    if (this->skybox_choice != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/src/renderer.cpp"
                    ,0x1d4,
                    "void ShadingPass::execute(glm::mat4, glm::mat4, float, float, glm::vec3, glm::mat4, Cubemap *, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, unsigned int, const Cubemap &, unsigned int)"
                   );
    }
LAB_0031d9be:
    (*gl3wProcs.ptr[0x1a])((ulong)this->cube_vao);
    uVar6 = gl3wProcs.ptr[0x22f];
    pSVar1 = &this->skybox_program;
    uVar8 = Shader::id(pSVar1);
    (*(code *)uVar6)((ulong)uVar8);
    uVar6 = gl3wProcs.ptr[0x227];
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"viewproj",&local_3da);
    uVar8 = Shader::getLoc(pSVar1,&local_90);
    glm::tmat3x3<float,_(glm::precision)0>::tmat3x3
              ((tmat3x3<float,_(glm::precision)0> *)&local_370.field_0,&viewMatrix);
    local_70._0_8_ = local_370._0_8_;
    local_70.field_0.z = local_370.field_0.z;
    local_70.field_0.w = 0.0;
    local_60 = local_364;
    local_58 = local_35c;
    local_54 = 0;
    local_50 = local_358;
    local_48 = local_350;
    local_44 = 0;
    uStack_3c = 0;
    local_34 = 0x3f800000;
    glm::operator*(&local_3b0,&projMatrix,(tmat4x4<float,_(glm::precision)0> *)&local_70.field_0);
    (*(code *)uVar6)((ulong)uVar8,1,0,&local_3b0);
    std::__cxx11::string::~string((string *)&local_90);
    uVar6 = gl3wProcs.ptr[0x1fb];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"scale",(allocator<char> *)&local_3b0);
    uVar8 = Shader::getLoc(pSVar1,&local_b0);
    (*(code *)uVar6)((local_3c8 + local_3cc) * 0.5,(ulong)uVar8);
    std::__cxx11::string::~string((string *)&local_b0);
    (*gl3wProcs.ptr[1])(0x84c0);
    uVar6 = gl3wProcs.ptr[0x16];
    uVar8 = Cubemap::id(local_3d8);
    (*(code *)uVar6)(0x8513,(ulong)uVar8);
    uVar6 = gl3wProcs.ptr[0x1fd];
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"skybox",(allocator<char> *)&local_3b0);
    uVar8 = Shader::getLoc(pSVar1,&local_d0);
    (*(code *)uVar6)((ulong)uVar8);
    std::__cxx11::string::~string((string *)&local_d0);
    (*gl3wProcs.ptr[0x83])(4,0,0x24);
  }
  bVar7 = ImGui::CollapsingHeader("Point light",0);
  if (bVar7) {
    ImGui::ColorEdit3("Light color",execute::lightColor,0);
    ImGui::DragFloat3("Light position",execute::lightPos,0.001,-10.0,10.0,"%.3f",1.0);
    ImGui::Separator();
  }
  uVar6 = gl3wProcs.ptr[0x22f];
  pSVar1 = &this->shading_program;
  uVar8 = Shader::id(pSVar1);
  (*(code *)uVar6)((ulong)uVar8);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"pointLightsNum",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_f0);
  (*(code *)uVar6)((ulong)uVar8,1);
  std::__cxx11::string::~string((string *)&local_f0);
  uVar6 = gl3wProcs.ptr[0x20c];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"pointLights[0].position",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_110);
  (*(code *)uVar6)((ulong)uVar8,1,execute::lightPos);
  std::__cxx11::string::~string((string *)&local_110);
  uVar6 = gl3wProcs.ptr[0x20c];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"pointLights[0].color",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_130);
  (*(code *)uVar6)((ulong)uVar8,1,execute::lightColor);
  std::__cxx11::string::~string((string *)&local_130);
  glm::detail::compute_inverse<glm::tmat4x4,_float,_(glm::precision)0,_false>::call
            (&local_3b0,&viewMatrix);
  uVar6 = gl3wProcs.ptr[0x20c];
  local_70._0_8_ = local_3b0.value[3].field_0._0_8_;
  local_70.field_0.z = local_3b0.value[3].field_0.field_0.z;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"camPos",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_150);
  (*(code *)uVar6)((ulong)uVar8,1,&local_70);
  std::__cxx11::string::~string((string *)&local_150);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"albedotex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_170);
  (*(code *)uVar6)((ulong)uVar8,0);
  std::__cxx11::string::~string((string *)&local_170);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"normaltex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_190);
  (*(code *)uVar6)((ulong)uVar8,1);
  std::__cxx11::string::~string((string *)&local_190);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"depthtex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_1b0);
  (*(code *)uVar6)((ulong)uVar8,2);
  std::__cxx11::string::~string((string *)&local_1b0);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"roughmettex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_1d0);
  (*(code *)uVar6)((ulong)uVar8,3);
  std::__cxx11::string::~string((string *)&local_1d0);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"positiontex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_1f0);
  (*(code *)uVar6)((ulong)uVar8,4);
  std::__cxx11::string::~string((string *)&local_1f0);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"ssaotex",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_210);
  (*(code *)uVar6)((ulong)uVar8,5);
  std::__cxx11::string::~string((string *)&local_210);
  uVar6 = gl3wProcs.ptr[0x1fd];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"irradianceMap",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_230);
  (*(code *)uVar6)((ulong)uVar8,6);
  std::__cxx11::string::~string((string *)&local_230);
  uVar6 = gl3wProcs.ptr[0x20b];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"sunLight.dir",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_250);
  (*(code *)uVar6)(local_348._0_4_,CONCAT44(local_348._4_4_,local_348._4_4_),local_3b4,(ulong)uVar8)
  ;
  std::__cxx11::string::~string((string *)&local_250);
  uVar6 = gl3wProcs.ptr[0x20b];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"sunLight.color",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_270);
  (*(code *)uVar6)(0x3f800000,0x3f800000,0x3f800000,(ulong)uVar8);
  std::__cxx11::string::~string((string *)&local_270);
  uVar6 = gl3wProcs.ptr[0x227];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"lightSpaceMatrix",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_290);
  (*(code *)uVar6)((ulong)uVar8,1,0,&lightMatrix);
  std::__cxx11::string::~string((string *)&local_290);
  uVar6 = gl3wProcs.ptr[0x1fb];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"ambientIntensity",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_2b0);
  (*(code *)uVar6)(this->ambient_intensity,(ulong)uVar8);
  std::__cxx11::string::~string((string *)&local_2b0);
  uVar6 = gl3wProcs.ptr[0x1fb];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"shadowBias",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_2d0);
  (*(code *)uVar6)(this->shadow_bias,(ulong)uVar8);
  std::__cxx11::string::~string((string *)&local_2d0);
  uVar6 = gl3wProcs.ptr[0x1fb];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"use_pcf",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_2f0);
  (*(code *)uVar6)((float)(int)this->use_pcf,(ulong)uVar8);
  std::__cxx11::string::~string((string *)&local_2f0);
  uVar6 = gl3wProcs.ptr[0x1ff];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"frame_num",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_310);
  (*(code *)uVar6)((ulong)uVar8,(ulong)this->frame_num);
  std::__cxx11::string::~string((string *)&local_310);
  uVar6 = gl3wProcs.ptr[0x1fb];
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"pcf_radius",(allocator<char> *)&local_3b0);
  uVar8 = Shader::getLoc(pSVar1,&local_330);
  (*(code *)uVar6)(this->pcf_radius,(ulong)uVar8);
  std::__cxx11::string::~string((string *)&local_330);
  (*gl3wProcs.ptr[1])(0x84c0);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)local_3b8);
  (*gl3wProcs.ptr[1])(0x84c1);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)local_3bc);
  (*gl3wProcs.ptr[1])(0x84c2);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)local_3c0);
  (*gl3wProcs.ptr[1])(0x84c3);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)local_3c4);
  (*gl3wProcs.ptr[1])(0x84c4);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)position_tex);
  (*gl3wProcs.ptr[1])(0x84c5);
  (*gl3wProcs.ptr[0x16])(0xde1,(ulong)ssao_tex);
  (*gl3wProcs.ptr[1])(0x84c6);
  uVar6 = gl3wProcs.ptr[0x16];
  uVar8 = Cubemap::id(irradiance);
  (*(code *)uVar6)(0x8513,(ulong)uVar8);
  (*gl3wProcs.ptr[0x1a])((ulong)vao);
  (*gl3wProcs.ptr[0x83])(4,0,3);
  (*gl3wProcs.ptr[0xf])(0x8d40,0);
  this->frame_num = this->frame_num + 1;
  pGVar10 = tracy::GetGpuCtx();
  pGVar4 = pGVar10->ptr;
  uVar8 = pGVar4->m_head;
  uVar12 = uVar8 + 1 & 0xffff;
  pGVar4->m_head = uVar12;
  uVar6 = gl3wProcs.ptr[0x1b1];
  if (uVar12 != pGVar4->m_tail) {
    pGVar10 = tracy::GetGpuCtx();
    (*(code *)uVar6)((ulong)pGVar10->ptr->m_query[uVar8],0x8e28);
    pEVar9 = tracy::GetToken();
    uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar11 = pEVar9;
    if ((uVar2 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
      pEVar11 = extraout_RAX_01;
    }
    pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
    uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
    (pBVar3->field_0).elements[uVar13] = '%';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
    *(undefined4 *)((long)&pBVar3->field_0 + uVar13 + 9) = 0;
    *(short *)((long)&pBVar3->field_0 + uVar13 + 0xd) = (short)uVar8;
    pGVar10 = tracy::GetGpuCtx();
    (pBVar3->field_0).elements[uVar13 + 0xf] = pGVar10->ptr->m_context;
    (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
    pEVar9 = tracy::GetToken();
    uVar2 = (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i;
    pEVar11 = pEVar9;
    if ((uVar2 & 0xffff) == 0) {
      tracy::moodycamel::
      ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
      ExplicitProducer::enqueue_begin_alloc(pEVar9,uVar2);
      pEVar11 = extraout_RAX_02;
    }
    pBVar3 = (pEVar9->super_ProducerBase).tailBlock;
    uVar13 = (ulong)(uint)((int)(uVar2 & 0xffff) << 5);
    (pBVar3->field_0).elements[uVar13] = '\x11';
    uVar5 = rdtsc();
    *(ulong *)((long)&pBVar3->field_0 + uVar13 + 1) =
         (uVar5 & 0xffffffff00000000) + CONCAT44((int)((ulong)pEVar11 >> 0x20),(int)uVar5);
    (pEVar9->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = uVar2 + 1;
    return;
  }
LAB_0031e62c:
  __assert_fail("m_head != m_tail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/tracy/TracyOpenGL.hpp"
                ,0xb4,"unsigned int tracy::GpuCtx::NextQueryId()");
}

Assistant:

void ShadingPass::execute(glm::mat4 viewMatrix, glm::mat4 projMatrix, float zNear, float zFar, glm::vec3 lightDir, glm::mat4 lightMatrix, Cubemap* cubemap, unsigned int albedo_tex, unsigned int normal_tex, unsigned int shadow_tex, unsigned int rough_met_tex, unsigned int position_tex, unsigned int ssao_tex, const Cubemap& irradiance, unsigned int vao)
{
    ZoneScopedN("Shading pass");
    TracyGpuZone("Shading pass");
    GLScopedDebugGroup("Shading pass");

    glBindFramebuffer(GL_FRAMEBUFFER, fbo);
    glClear(GL_COLOR_BUFFER_BIT);

    const Cubemap* skyboxMap = nullptr;
    switch(skybox_choice) {
        case 0:
            skyboxMap = cubemap;
            break;
        case 1:
            skyboxMap = &irradiance;
            break;

        default:
            assert(false);
    }

    if (skyboxMap) {
        glBindVertexArray(cube_vao);
        glUseProgram(skybox_program.id());
        glUniformMatrix4fv(skybox_program.getLoc("viewproj"), 1, GL_FALSE, glm::value_ptr(projMatrix * glm::mat4(glm::mat3(viewMatrix))));
        glUniform1f(skybox_program.getLoc("scale"), 0.5f*(zNear+zFar));
        glActiveTexture(GL_TEXTURE0);
        glBindTexture(GL_TEXTURE_CUBE_MAP, skyboxMap->id());
        glUniform1i(skybox_program.getLoc("skybox"), 0);
        glDrawArrays(GL_TRIANGLES, 0, 36);
    }

    static float lightPos[3] = { 4.f, 1.f, 6.f };
    static float lightColor[3] = { 1.f, 1.f, 1.f };
    if (ImGui::CollapsingHeader("Point light")) {
        ImGui::ColorEdit3("Light color", lightColor);
        ImGui::DragFloat3("Light position", lightPos, 0.001f, -10.f, 10.f);
        ImGui::Separator();
    }

    glUseProgram(shading_program.id());
    glUniform1i(shading_program.getLoc("pointLightsNum"), 1);
    glUniform3fv(shading_program.getLoc("pointLights[0].position"), 1, lightPos);
    glUniform3fv(shading_program.getLoc("pointLights[0].color"), 1, lightColor);
    glm::vec3 cameraPosition = glm::vec3(glm::inverse(viewMatrix)[3]);
    glUniform3fv(shading_program.getLoc("camPos"), 1, glm::value_ptr(cameraPosition));
    glUniform1i(shading_program.getLoc("albedotex"), 0);
    glUniform1i(shading_program.getLoc("normaltex"), 1);
    glUniform1i(shading_program.getLoc("depthtex"), 2);
    glUniform1i(shading_program.getLoc("roughmettex"), 3);
    glUniform1i(shading_program.getLoc("positiontex"), 4);
    glUniform1i(shading_program.getLoc("ssaotex"), 5);
    glUniform1i(shading_program.getLoc("irradianceMap"), 6);
    glUniform3f(shading_program.getLoc("sunLight.dir"), lightDir.x, lightDir.y, lightDir.z);
    glUniform3f(shading_program.getLoc("sunLight.color"), 1.f, 1.f, 1.f);
    glUniformMatrix4fv(shading_program.getLoc("lightSpaceMatrix"), 1, GL_FALSE, glm::value_ptr(lightMatrix));
    glUniform1f(shading_program.getLoc("ambientIntensity"), ambient_intensity);
    glUniform1f(shading_program.getLoc("shadowBias"), shadow_bias);
    glUniform1f(shading_program.getLoc("use_pcf"), use_pcf);
    glUniform1ui(shading_program.getLoc("frame_num"), frame_num);
    glUniform1f(shading_program.getLoc("pcf_radius"), pcf_radius);

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, albedo_tex);
    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normal_tex);
    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, shadow_tex);
    glActiveTexture(GL_TEXTURE3);
    glBindTexture(GL_TEXTURE_2D, rough_met_tex);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_2D, position_tex);
    glActiveTexture(GL_TEXTURE5);
    glBindTexture(GL_TEXTURE_2D, ssao_tex);
    glActiveTexture(GL_TEXTURE6);
    glBindTexture(GL_TEXTURE_CUBE_MAP, irradiance.id());
    
    glBindVertexArray(vao);
    glDrawArrays(GL_TRIANGLES, 0, 3);

    glBindFramebuffer(GL_FRAMEBUFFER, 0);

    frame_num++;
}